

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void expandFormatArguments<String,String,StringList>
               (vector<String,_std::allocator<String>_> *data,String *arg,String *rest,
               StringList *rest_1)

{
  String *__x;
  FormatArgument local_48;
  StringList *local_28;
  StringList *rest_local_1;
  String *rest_local;
  String *arg_local;
  vector<String,_std::allocator<String>_> *data_local;
  
  local_28 = rest_1;
  rest_local_1 = (StringList *)rest;
  rest_local = arg;
  arg_local = (String *)data;
  FormatArgument::FormatArgument<String>(&local_48,arg);
  __x = FormatArgument::text(&local_48);
  std::vector<String,_std::allocator<String>_>::push_back(data,__x);
  FormatArgument::~FormatArgument(&local_48);
  expandFormatArguments<String,StringList>
            ((vector<String,_std::allocator<String>_> *)arg_local,(String *)rest_local_1,local_28);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}